

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv_pipe_connect2(uv_connect_t *req,uv_pipe_t *handle,char *name,size_t namelen,uint flags,
                    uv_connect_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  socklen_t __len;
  undefined1 local_9e [18];
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 uStack_4c;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  if (namelen == 0) {
    return -0x16;
  }
  if (name == (char *)0x0) {
    return -0x16;
  }
  if (1 < flags) {
    return -0x16;
  }
  pvVar4 = memchr(name + 1,0,namelen - 1);
  if (pvVar4 != (void *)0x0) {
    return -0x16;
  }
  if (0x6b < namelen) {
    return -0x24;
  }
  iVar2 = (handle->io_watcher).fd;
  if (iVar2 == -1) {
    iVar3 = uv__socket(1,1,0);
    if (iVar3 < 0) goto LAB_001146b9;
    (handle->io_watcher).fd = iVar3;
  }
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_4c = 0;
  uStack_44 = 0;
  local_40 = 0;
  local_5c = 0;
  uStack_54 = 0;
  local_6c = 0;
  uStack_64 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_8c = 0;
  uStack_84 = 0;
  local_9e[2] = '\0';
  local_9e[3] = '\0';
  local_9e[4] = '\0';
  local_9e[5] = '\0';
  local_9e[6] = '\0';
  local_9e[7] = '\0';
  local_9e[8] = '\0';
  local_9e[9] = '\0';
  local_9e._10_8_ = 0;
  memcpy(local_9e + 2,name,namelen);
  local_9e._0_2_ = 1;
  __len = 0x6e;
  if (*name == '\0') {
    __len = (int)namelen + 2;
  }
  do {
    iVar3 = connect((handle->io_watcher).fd,(sockaddr *)local_9e,__len);
    if (iVar3 != -1) goto LAB_00114678;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
  } while (iVar3 == 4);
  if (iVar3 == 0x73) {
LAB_00114678:
    if ((iVar2 != -1) ||
       (iVar3 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0xc000), iVar3 == 0))
    {
      uv__io_start(handle->loop,&handle->io_watcher,4);
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -iVar3;
  }
LAB_001146b9:
  handle->delayed_error = iVar3;
  handle->connect_req = req;
  req->loop = handle->loop;
  req->type = UV_CONNECT;
  paVar1 = &handle->loop->active_reqs;
  paVar1->count = paVar1->count + 1;
  req->handle = (uv_stream_t *)handle;
  req->cb = cb;
  (req->queue).next = &req->queue;
  (req->queue).prev = &req->queue;
  if (iVar3 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return 0;
}

Assistant:

int uv_pipe_connect2(uv_connect_t* req,
                     uv_pipe_t* handle,
                     const char* name,
                     size_t namelen,
                     unsigned int flags,
                     uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;
  socklen_t addrlen;

  if (flags & ~UV_PIPE_NO_TRUNCATE)
    return UV_EINVAL;

  if (name == NULL)
    return UV_EINVAL;

  if (namelen == 0)
    return UV_EINVAL;

  if (includes_nul(name, namelen))
    return UV_EINVAL;

  if (namelen > sizeof(saddr.sun_path) - 1)
    return UV_ENAMETOOLONG;

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  memcpy(&saddr.sun_path, name, namelen);
  saddr.sun_family = AF_UNIX;

  if (*name == '\0')
    addrlen = offsetof(struct sockaddr_un, sun_path) + namelen;
  else
    addrlen = sizeof saddr;

  do {
    r = connect(uv__stream_fd(handle), (struct sockaddr*)&saddr, addrlen);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = UV__ERR(errno);
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == UV_EBADF)
      err = UV_ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*) handle;
  req->cb = cb;
  uv__queue_init(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}